

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void vkt::shaderexecutor::
     ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doPrintValue
               (FloatFormat *fmt,Matrix<float,_3,_2> *value,ostream *os)

{
  char *pcVar1;
  ostream *poVar2;
  Vector<float,_3> *value_00;
  int local_24;
  int ndx;
  ostream *os_local;
  Matrix<float,_3,_2> *value_local;
  FloatFormat *fmt_local;
  
  pcVar1 = dataTypeNameOf<tcu::Matrix<float,3,2>>();
  poVar2 = std::operator<<(os,pcVar1);
  std::operator<<(poVar2,"(");
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    if (0 < local_24) {
      std::operator<<(os,", ");
    }
    value_00 = tcu::Matrix<float,_3,_2>::operator[](value,local_24);
    printValue<tcu::Vector<float,3>>(fmt,value_00,os);
  }
  std::operator<<(os,")");
  return;
}

Assistant:

static void			doPrintValue	(const FloatFormat& fmt, const T& value, ostream& os)
	{
		os << dataTypeNameOf<T>() << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printValue<Element>(fmt, value[ndx], os);
		}

		os << ")";
	}